

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

void double_computePow5(uint32_t i,uint64_t *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  int32_t iVar7;
  int32_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  uint128_t shiftedSum;
  byte local_5c;
  ulong uStack_58;
  uint32_t delta;
  uint128_t b2;
  uint128_t b0;
  uint64_t m;
  uint64_t *mul;
  uint32_t offset;
  uint32_t base2;
  uint32_t base;
  uint64_t *result_local;
  uint32_t i_local;
  
  uVar6 = i / 0x1a;
  if (i % 0x1a == 0) {
    *result = DOUBLE_POW5_SPLIT2[uVar6][0];
    result[1] = DOUBLE_POW5_SPLIT2[uVar6][1];
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = DOUBLE_POW5_TABLE[i % 0x1a];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = DOUBLE_POW5_SPLIT2[uVar6][0];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = DOUBLE_POW5_TABLE[i % 0x1a];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = DOUBLE_POW5_SPLIT2[uVar6][1];
    iVar7 = pow5bits(i);
    iVar8 = pow5bits(uVar6 * 0x1a);
    b2._8_8_ = SUB168(auVar1 * auVar3,0);
    b0._0_8_ = SUB168(auVar1 * auVar3,8);
    local_5c = (byte)(iVar7 - iVar8);
    uVar9 = (ulong)b0 >> (local_5c & 0x3f);
    bVar13 = (iVar7 - iVar8 & 0x40U) != 0;
    uVar10 = b2._8_8_ >> (local_5c & 0x3f) | (ulong)b0 << 0x40 - (local_5c & 0x3f);
    if (bVar13) {
      uVar10 = uVar9;
    }
    if (bVar13) {
      uVar9 = 0;
    }
    uStack_58 = SUB168(auVar2 * auVar4,0);
    b2._0_8_ = SUB168(auVar2 * auVar4,8);
    local_5c = 0x40 - local_5c;
    uVar11 = uStack_58 << (local_5c & 0x3f);
    uVar12 = uVar11;
    uVar5 = (long)b2 << (local_5c & 0x3f) | uStack_58 >> 0x40 - (local_5c & 0x3f);
    if ((local_5c & 0x40) != 0) {
      uVar12 = 0;
      uVar5 = uVar11;
    }
    uVar11 = (ulong)(POW5_OFFSETS[i >> 4] >> ((byte)i & 0xf) * '\x02' & 3);
    *result = uVar10 + uVar12 + uVar11;
    result[1] = uVar9 + uVar5 + (ulong)CARRY8(uVar10,uVar12) + (ulong)CARRY8(uVar10 + uVar12,uVar11)
    ;
  }
  return;
}

Assistant:

static inline void double_computePow5(const uint32_t i, uint64_t* const result) {
	const uint32_t base = i / POW5_TABLE_SIZE;
	const uint32_t base2 = base * POW5_TABLE_SIZE;
	const uint32_t offset = i - base2;
	const uint64_t* const mul = DOUBLE_POW5_SPLIT2[base];
	if (offset == 0) {
		result[0] = mul[0];
		result[1] = mul[1];
		return;
	}
	const uint64_t m = DOUBLE_POW5_TABLE[offset];
	const uint128_t b0 = ((uint128_t) m) * mul[0];
	const uint128_t b2 = ((uint128_t) m) * mul[1];
	const uint32_t delta = pow5bits(i) - pow5bits(base2);
	const uint128_t shiftedSum = (b0 >> delta) + (b2 << (64 - delta)) + ((POW5_OFFSETS[i / 16] >> ((i % 16) << 1)) & 3);
	result[0] = (uint64_t) shiftedSum;
	result[1] = (uint64_t) (shiftedSum >> 64);
}